

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgamma.c
# Opt level: O0

void CalculateGamma(double gamma,Uint16 *ramp)

{
  double dVar1;
  int local_20;
  int local_1c;
  int value;
  int i;
  Uint16 *ramp_local;
  double gamma_local;
  
  for (local_1c = 0; local_1c < 0x100; local_1c = local_1c + 1) {
    dVar1 = pow((double)local_1c / 256.0,1.0 / gamma);
    local_20 = (int)(dVar1 * 65535.0 + 0.5);
    if (0xffff < local_20) {
      local_20 = 0xffff;
    }
    ramp[local_1c] = (Uint16)local_20;
  }
  return;
}

Assistant:

void CalculateGamma(double gamma, Uint16 *ramp)
{
	int i, value;

	gamma = 1.0 / gamma;
	for ( i=0; i<256; ++i ) {
		value = (int)(pow((double)i/256.0, gamma)*65535.0 + 0.5);
		if ( value > 65535 ) {
			value = 65535;
		}
		ramp[i] = (Uint16)value;
	}
}